

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handlemgr.cpp
# Opt level: O1

PAL_ERROR __thiscall
CorUnix::CSimpleHandleManager::AllocateHandle
          (CSimpleHandleManager *this,CPalThread *pThread,IPalObject *pObject,DWORD dwAccessRights,
          bool fInheritable,HANDLE *ph)

{
  IPalObject *pIVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  HANDLE_TABLE_ENTRY *pHVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  PAL_ERROR local_34;
  
  InternalEnterCriticalSection(pThread,&this->m_csLock);
  local_34 = 0;
  if (this->m_hiFreeListStart == 0xffffffffffffffff) {
    if (PAL_InitializeChakraCoreCalled == false) {
LAB_002c5813:
      abort();
    }
    uVar3 = this->m_dwTableGrowthRate + this->m_dwTableSize;
    local_34 = 0xe;
    if (uVar3 < 0x3ffffffe) {
      pHVar5 = (HANDLE_TABLE_ENTRY *)InternalRealloc(this->m_rghteHandleTable,(ulong)uVar3 << 4);
      if (pHVar5 == (HANDLE_TABLE_ENTRY *)0x0) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_002c5813;
        goto LAB_002c5784;
      }
      this->m_rghteHandleTable = pHVar5;
      uVar3 = this->m_dwTableSize;
      uVar6 = (ulong)uVar3;
      uVar4 = this->m_dwTableGrowthRate + uVar3;
      if (uVar3 < uVar4) {
        lVar7 = uVar6 << 4;
        uVar8 = uVar6;
        do {
          uVar8 = uVar8 + 1;
          *(ulong *)((long)&this->m_rghteHandleTable->u + lVar7) = uVar8;
          (&this->m_rghteHandleTable->fEntryAllocated)[lVar7] = false;
          uVar6 = (ulong)this->m_dwTableSize;
          uVar4 = this->m_dwTableGrowthRate + this->m_dwTableSize;
          lVar7 = lVar7 + 0x10;
        } while (uVar8 < uVar4);
      }
      this->m_hiFreeListStart = uVar6;
      this->m_dwTableSize = uVar4;
      this->m_rghteHandleTable[uVar4 - 1].u.hiNextIndex = 0xffffffffffffffff;
      this->m_hiFreeListEnd = (ulong)(this->m_dwTableSize - 1);
      bVar2 = true;
      local_34 = 0;
    }
    else {
LAB_002c5784:
      bVar2 = false;
    }
    if (!bVar2) goto LAB_002c57f6;
  }
  uVar6 = (ulong)(uint)this->m_hiFreeListStart;
  pIVar1 = this->m_rghteHandleTable[uVar6].u.pObject;
  this->m_hiFreeListStart = (HANDLE_INDEX)pIVar1;
  if (pIVar1 == (IPalObject *)0xffffffffffffffff) {
    this->m_hiFreeListEnd = 0xffffffffffffffff;
  }
  *ph = (HANDLE)(uVar6 * 4 + 4);
  (*pObject->_vptr_IPalObject[7])(pObject);
  this->m_rghteHandleTable[uVar6].u.pObject = pObject;
  pHVar5 = this->m_rghteHandleTable;
  pHVar5[uVar6].dwAccessRights = dwAccessRights;
  pHVar5[uVar6].fInheritable = fInheritable;
  pHVar5[uVar6].fEntryAllocated = true;
LAB_002c57f6:
  InternalLeaveCriticalSection(pThread,&this->m_csLock);
  return local_34;
}

Assistant:

PAL_ERROR
CSimpleHandleManager::AllocateHandle(
    CPalThread *pThread,
    IPalObject *pObject,
    DWORD dwAccessRights,
    bool fInheritable,
    HANDLE *ph
    )
{
    PAL_ERROR palError = NO_ERROR;
    DWORD dwIndex;

    Lock(pThread);

    /* if no free handles are available, we need to grow the handle table and
       add new handles to the pool */
    if (m_hiFreeListStart == c_hiInvalid)
    {
        HANDLE_TABLE_ENTRY* rghteTempTable;

        TRACE("Handle pool empty (%d handles allocated), growing handle table "
              "by %d entries.\n", m_dwTableSize, m_dwTableGrowthRate );

        /* make sure handle values don't overflow */
        if (m_dwTableSize + m_dwTableGrowthRate >= c_MaxIndex)
        {
            WARN("Unable to allocate handle : maximum (%d) reached!\n",
                 m_dwTableSize);
            palError = ERROR_OUTOFMEMORY;
            goto AllocateHandleExit;
        }

        /* grow handle table */
        rghteTempTable = reinterpret_cast<HANDLE_TABLE_ENTRY*>(InternalRealloc(
            m_rghteHandleTable,
            (m_dwTableSize + m_dwTableGrowthRate) * sizeof(HANDLE_TABLE_ENTRY)));
        
        if (NULL == rghteTempTable)
        {
            WARN("not enough memory to grow handle table!\n");
            palError = ERROR_OUTOFMEMORY;
            goto AllocateHandleExit;
        }
        m_rghteHandleTable = rghteTempTable;

        /* update handle table and handle pool */
        for (DWORD dw = m_dwTableSize; dw < m_dwTableSize + m_dwTableGrowthRate; dw += 1)
        {
            /* new handles are initially invalid */
            /* the last "old" handle was m_dwTableSize-1, so the new
               handles range from m_dwTableSize to
               m_dwTableSize+m_dwTableGrowthRate-1 */
            m_rghteHandleTable[dw].u.hiNextIndex = dw + 1;
            m_rghteHandleTable[dw].fEntryAllocated = FALSE;
        }

        m_hiFreeListStart = m_dwTableSize;
        m_dwTableSize += m_dwTableGrowthRate;
        m_rghteHandleTable[m_dwTableSize - 1].u.hiNextIndex = (HANDLE_INDEX)-1;
        m_hiFreeListEnd = m_dwTableSize - 1;
        
    }

    /* take the next free handle */
    dwIndex = m_hiFreeListStart;

    /* remove the handle from the pool */
    m_hiFreeListStart = m_rghteHandleTable[dwIndex].u.hiNextIndex;
    
    /* clear the tail record if this is the last handle slot available */
    if(m_hiFreeListStart == c_hiInvalid) 
    {
        m_hiFreeListEnd = c_hiInvalid;
    }

    /* save the data associated with the new handle */
    *ph = HandleIndexToHandle(dwIndex);
    
    pObject->AddReference();
    m_rghteHandleTable[dwIndex].u.pObject = pObject;
    m_rghteHandleTable[dwIndex].dwAccessRights = dwAccessRights;
    m_rghteHandleTable[dwIndex].fInheritable = fInheritable;
    m_rghteHandleTable[dwIndex].fEntryAllocated = TRUE;

AllocateHandleExit:

    Unlock(pThread);

    return palError;    
}